

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

uint TTA::Flatten(void)

{
  uint local_10;
  uint local_c;
  uint k;
  uint cur_label;
  
  local_c = 1;
  for (local_10 = 1; local_10 < length_; local_10 = local_10 + 1) {
    if (rtable_[local_10] == local_10) {
      local_c = local_c + 1;
      rtable_[local_10] = local_c;
    }
    else {
      rtable_[local_10] = rtable_[rtable_[local_10]];
    }
  }
  return local_c;
}

Assistant:

static unsigned Flatten()
    {
        unsigned cur_label = 1;
        for (unsigned k = 1; k < length_; k++) {
            if (rtable_[k] == k) {
                cur_label++;
                rtable_[k] = cur_label;
            }
            else
                rtable_[k] = rtable_[rtable_[k]];
        }

        return cur_label;
    }